

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  sqlite3_vtab *psVar1;
  Fts3Table *pTab;
  sqlite_int64 iValue;
  bool bVar2;
  Fts3Cursor *pFVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uchar *pX;
  byte *pbVar9;
  size_t sVar10;
  size_t sVar11;
  MatchinfoBuffer *pMVar12;
  u8 *z;
  Mem *pMVar13;
  LcsIterator *pCtx;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  LcsIterator *pLVar17;
  byte *__s2;
  char **ppOut;
  undefined4 uVar18;
  Fts3Expr *pFVar19;
  LcsIterator *pIter;
  byte *pbVar20;
  u8 *__s;
  Fts3Cursor *pFVar21;
  long lVar22;
  uchar *pStart;
  long lVar23;
  long lVar24;
  long in_FS_OFFSET;
  Fts3Cursor *pCsr;
  char *pEnd;
  char *a;
  int nPhrase;
  int iPhrase;
  _func_void_void_ptr *local_c0;
  long local_b8;
  Fts3Cursor *local_a0;
  MatchInfo local_98;
  undefined1 *local_70;
  char *local_68;
  undefined8 local_60;
  sqlite3_stmt *local_58;
  int local_4c;
  Fts3Cursor *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = (Fts3Cursor *)&DAT_aaaaaaaaaaaaaaaa;
  iVar6 = fts3FunctionArg(pContext,"matchinfo",*apVal,&local_a0);
  if (iVar6 == 0) {
    if (nVal < 2) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = (byte *)sqlite3ValueText(apVal[1],'\x01');
    }
    pFVar3 = local_a0;
    pFVar19 = local_a0->pExpr;
    __s2 = (byte *)"pcx";
    if (pbVar9 != (byte *)0x0) {
      __s2 = pbVar9;
    }
    if (pFVar19 == (Fts3Expr *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        setResultStrOrError(pContext,"",0,'\0',(_func_void_void_ptr *)0x0);
        return;
      }
      goto LAB_001d5bb1;
    }
    psVar1 = (local_a0->base).pVtab;
    local_98.flag = '\0';
    local_98._25_7_ = 0;
    local_98.aMatchinfo = (u32 *)0x0;
    local_98.nDoc = 0;
    local_98.pCursor = local_a0;
    local_98.nPhrase = 0;
    local_98.nCol = *(uint *)&psVar1[2].pModule;
    pMVar12 = local_a0->pMIBuffer;
    if (pMVar12 == (MatchinfoBuffer *)0x0) {
LAB_001d50c7:
      lVar23 = 0;
      local_58 = (sqlite3_stmt *)((ulong)local_58 & 0xffffffff00000000);
      local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
      fts3ExprIterate2(pFVar19,(int *)&local_48,fts3ExprPhraseCountCb,&local_58);
      pFVar3->nPhrase = (int)local_58;
      local_98.nPhrase = (int)local_58;
      bVar5 = *__s2;
      if (bVar5 != 0) {
        lVar23 = 0;
        pbVar9 = __s2;
        do {
          pbVar9 = pbVar9 + 1;
          local_48 = (Fts3Cursor *)0x0;
          uVar16 = bVar5 - 0x62;
          if (0x17 < uVar16) {
LAB_001d513d:
            if (bVar5 == 0x61) {
LAB_001d5146:
              if (*(char *)((long)&psVar1[0x13].pModule + 4) != '\0') goto LAB_001d5163;
            }
LAB_001d532a:
            sqlite3Fts3ErrMsg((char **)&local_48,"unrecognized matchinfo request: %c");
            pFVar3 = local_48;
            pContext->isError = 1;
            sqlite3VdbeMemSetStr
                      (pContext->pOut,(char *)local_48,-1,'\x01',
                       (_func_void_void_ptr *)0xffffffffffffffff);
            sqlite3_free(pFVar3);
            goto LAB_001d5b6d;
          }
          if ((0xc24003U >> (uVar16 & 0x1f) & 1) == 0) {
            if (uVar16 != 10) {
              if (uVar16 != 0xc) goto LAB_001d513d;
              goto LAB_001d5146;
            }
            if (*(char *)((long)&psVar1[0x13].pModule + 6) == '\0') goto LAB_001d532a;
          }
LAB_001d5163:
          sVar10 = fts3MatchinfoSize(&local_98,bVar5);
          lVar23 = lVar23 + sVar10;
          bVar5 = *pbVar9;
        } while (bVar5 != 0);
      }
      sVar11 = strlen((char *)__s2);
      pMVar12 = (MatchinfoBuffer *)sqlite3Fts3MallocZero(sVar11 + lVar23 * 8 + 0x25);
      if (pMVar12 != (MatchinfoBuffer *)0x0) {
        pMVar12->aMatchinfo[0] = 0x1c;
        pMVar12->aMatchinfo[lVar23 + 1] = (int)((lVar23 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
        pMVar12->nElem = (int)lVar23;
        pMVar12->zMatchinfo = (char *)(pMVar12[1].aRef + lVar23 * 8 + 4);
        memcpy(pMVar12[1].aRef + lVar23 * 8 + 4,__s2,sVar11 + 1);
        pMVar12->aRef[0] = '\x01';
        pFVar3->pMIBuffer = pMVar12;
        pFVar3->isMatchinfoNeeded = 1;
        bVar2 = false;
        goto LAB_001d5252;
      }
      pFVar3->pMIBuffer = (MatchinfoBuffer *)0x0;
      pFVar3->isMatchinfoNeeded = 1;
LAB_001d5318:
      sqlite3_result_error_code(pContext,7);
    }
    else {
      iVar6 = strcmp(pMVar12->zMatchinfo,(char *)__s2);
      if (iVar6 != 0) {
        pMVar12->aRef[0] = '\0';
        if ((pMVar12->aRef[1] == '\0') && (pMVar12->aRef[2] == '\0')) {
          sqlite3_free(pMVar12);
        }
        pFVar3->pMIBuffer = (MatchinfoBuffer *)0x0;
        pFVar19 = pFVar3->pExpr;
        goto LAB_001d50c7;
      }
      bVar2 = true;
LAB_001d5252:
      if (pMVar12->aRef[1] == '\0') {
        pMVar12->aRef[1] = '\x01';
        z = &pMVar12->field_0x1c;
        local_c0 = fts3MIBufferFree;
      }
      else if (pMVar12->aRef[2] == '\0') {
        pMVar12->aRef[2] = '\x01';
        z = pMVar12[1].aRef + (long)pMVar12->nElem * 4;
        local_c0 = fts3MIBufferFree;
      }
      else {
        iVar6 = pMVar12->nElem;
        iVar7 = sqlite3_initialize();
        if ((iVar7 != 0) || (z = (u8 *)sqlite3Malloc((long)iVar6 << 2), z == (u8 *)0x0))
        goto LAB_001d5318;
        local_c0 = sqlite3_free;
        if (pMVar12->bGlobal != 0) {
          memcpy(z,&pMVar12->field_0x1c,(long)pMVar12->nElem << 2);
        }
      }
      local_98.nPhrase = pFVar3->nPhrase;
      pTab = (Fts3Table *)(pFVar3->base).pVtab;
      local_58 = (sqlite3_stmt *)0x0;
      lVar23 = 0;
      __s = z;
      do {
        bVar5 = __s2[lVar23];
        local_98.aMatchinfo = (u32 *)__s;
        if (bVar5 == 0) {
          iVar6 = 0;
          break;
        }
        local_98.flag = bVar5;
        if (bVar5 < 0x6c) {
          if (bVar5 == 0x61) {
            if (bVar2) goto LAB_001d5675;
            local_48 = (Fts3Cursor *)&DAT_aaaaaaaaaaaaaaaa;
            local_60 = &DAT_aaaaaaaaaaaaaaaa;
            local_68 = &DAT_aaaaaaaaaaaaaaaa;
            local_4c = fts3MatchinfoSelectDoctotal
                                 (pTab,&local_58,(sqlite3_int64 *)&local_48,(char **)&local_60,
                                  &local_68);
            pFVar21 = local_48;
            iVar6 = local_4c;
            if (local_4c == 0) {
              iVar6 = 0;
              if (0 < local_98.nCol) {
                lVar24 = (long)local_48 / 2;
                lVar22 = 0;
                do {
                  local_70 = &DAT_aaaaaaaaaaaaaaaa;
                  iVar6 = sqlite3Fts3GetVarintU(local_60,(sqlite_uint64 *)&local_70);
                  local_60 = local_60 + iVar6;
                  if (local_68 < local_60) {
                    local_4c = 0x10b;
                    iVar6 = 0x10b;
                    break;
                  }
                  *(int *)((long)local_98.aMatchinfo + lVar22 * 4) =
                       (int)((long)(((ulong)local_70 & 0xffffffff) + lVar24) / (long)pFVar21);
                  lVar22 = lVar22 + 1;
                  iVar6 = 0;
                } while (lVar22 < local_98.nCol);
              }
            }
          }
          else {
            if (bVar5 == 0x62) goto LAB_001d54e6;
            if (bVar5 != 99) goto switchD_001d5403_caseD_6d;
            iVar6 = 0;
            if (!bVar2) {
              iVar6 = local_98.nCol;
              goto LAB_001d5665;
            }
          }
        }
        else {
          switch(bVar5) {
          case 0x6c:
            iValue = pFVar3->iPrevId;
            local_48 = (Fts3Cursor *)0x0;
            iVar6 = fts3SqlStmt(pTab,0x15,(sqlite3_stmt **)&local_48,(sqlite3_value **)0x0);
            pFVar21 = local_48;
            if (iVar6 == 0) {
              sqlite3_bind_int64((sqlite3_stmt *)local_48,1,iValue);
              iVar6 = sqlite3_step((sqlite3_stmt *)pFVar21);
              if (iVar6 == 100) {
                pMVar13 = columnMem((sqlite3_stmt *)pFVar21,0);
                uVar16._0_2_ = pMVar13->flags;
                uVar16._2_1_ = pMVar13->enc;
                uVar16._3_1_ = pMVar13->eSubtype;
                columnMallocFailure((sqlite3_stmt *)pFVar21);
                if ((0x1000000010001U >> ((ulong)uVar16 & 0x3f) & 1) != 0) {
                  local_4c = 0;
                  pMVar13 = columnMem((sqlite3_stmt *)pFVar21,0);
                  pbVar9 = (byte *)sqlite3_value_blob(pMVar13);
                  columnMallocFailure((sqlite3_stmt *)pFVar21);
                  iVar7 = sqlite3_column_bytes((sqlite3_stmt *)pFVar21,0);
                  iVar6 = local_4c;
                  if (0 < local_98.nCol) {
                    pbVar15 = pbVar9 + iVar7;
                    lVar22 = 0;
                    do {
                      iVar7 = (int)pbVar9 + 10;
                      uVar14 = 0xfffffffffffffff9;
                      lVar24 = 0;
                      pbVar20 = pbVar9;
                      do {
                        uVar18 = (undefined4)lVar24;
                        if (pbVar15 <= pbVar20) {
LAB_001d5a33:
                          iVar7 = (int)pbVar20 + 1;
                          break;
                        }
                        uVar14 = uVar14 + 7;
                        lVar24 = lVar24 + ((ulong)(*pbVar20 & 0x7f) << ((byte)uVar14 & 0x3f));
                        uVar18 = (undefined4)lVar24;
                        if (-1 < (char)*pbVar20) goto LAB_001d5a33;
                        pbVar20 = pbVar20 + 1;
                      } while (uVar14 < 0x39);
                      pbVar9 = pbVar9 + (iVar7 - (int)pbVar9);
                      if (pbVar15 < pbVar9) {
                        local_4c = 0x10b;
                        iVar6 = local_4c;
                        break;
                      }
                      *(undefined4 *)((long)local_98.aMatchinfo + lVar22 * 4) = uVar18;
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < local_98.nCol);
                  }
                  goto LAB_001d54a2;
                }
              }
              iVar6 = sqlite3_reset((sqlite3_stmt *)pFVar21);
              if (iVar6 == 0) {
                iVar6 = 0x10b;
              }
              pFVar21 = (Fts3Cursor *)0x0;
            }
LAB_001d54a2:
            local_4c = iVar6;
            sqlite3_reset((sqlite3_stmt *)pFVar21);
            iVar6 = local_4c;
            break;
          case 0x6d:
          case 0x6f:
          case 0x71:
          case 0x72:
switchD_001d5403_caseD_6d:
            pFVar19 = pFVar3->pExpr;
            local_40 = 0;
            local_60 = (char *)((ulong)local_60._4_4_ << 0x20);
            local_48 = pFVar3;
            iVar6 = fts3ExprIterate2(pFVar19,(int *)&local_60,fts3ExprLoadDoclistsCb,&local_48);
            local_4c = iVar6;
            if (iVar6 == 0) {
              if (bVar2) {
LAB_001d557f:
                local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                fts3ExprIterate2(pFVar19,(int *)&local_48,fts3ExprLocalHitsCb,&local_98);
                goto LAB_001d5675;
              }
              local_4c = 0;
              if ((pFVar3->pDeferred == (Fts3DeferredToken *)0x0) ||
                 (local_4c = iVar6,
                 iVar6 = fts3MatchinfoSelectDoctotal
                                   (pTab,&local_58,&local_98.nDoc,(char **)0x0,(char **)0x0),
                 local_4c = iVar6, iVar6 == 0)) {
                local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                local_4c = fts3ExprIterate2(pFVar19,(int *)&local_48,fts3ExprGlobalHitsCb,&local_98)
                ;
                sqlite3Fts3EvalTestDeferred(pFVar3,&local_4c);
                iVar6 = local_4c;
                if (local_4c == 0) goto LAB_001d557f;
              }
            }
            break;
          case 0x6e:
            if (bVar2) {
LAB_001d5675:
              iVar6 = 0;
            }
            else {
              local_48 = (Fts3Cursor *)0x0;
              iVar6 = fts3MatchinfoSelectDoctotal
                                (pTab,&local_58,(sqlite3_int64 *)&local_48,(char **)0x0,(char **)0x0
                                );
              *local_98.aMatchinfo = local_48._0_4_;
              local_4c = iVar6;
            }
            break;
          case 0x70:
            iVar6 = 0;
            if (!bVar2) {
              iVar6 = local_98.nPhrase;
LAB_001d5665:
              *(int *)__s = iVar6;
              iVar6 = 0;
            }
            break;
          case 0x73:
            local_40 = 0;
            local_60 = (char *)((ulong)local_60._4_4_ << 0x20);
            local_48 = pFVar3;
            iVar6 = fts3ExprIterate2(pFVar3->pExpr,(int *)&local_60,fts3ExprLoadDoclistsCb,&local_48
                                    );
            local_4c = iVar6;
            if (iVar6 == 0) {
              pCtx = (LcsIterator *)sqlite3Fts3MallocZero((long)pFVar3->nPhrase << 5);
              if (pCtx == (LcsIterator *)0x0) {
                iVar6 = 7;
                local_4c = iVar6;
              }
              else {
                local_48 = (Fts3Cursor *)((ulong)local_48 & 0xffffffff00000000);
                fts3ExprIterate2(pFVar3->pExpr,(int *)&local_48,fts3MatchinfoLcsCb,pCtx);
                if (0 < (long)local_98.nPhrase) {
                  lVar22 = 0;
                  iVar6 = 0;
                  do {
                    iVar6 = iVar6 - *(int *)(*(long *)(*(long *)((long)&pCtx->pExpr + lVar22) + 0x20
                                                      ) + 0x50);
                    *(int *)((long)&pCtx->iPosOffset + lVar22) = iVar6;
                    lVar22 = lVar22 + 0x20;
                  } while ((long)local_98.nPhrase * 0x20 != lVar22);
                }
                if (local_98.nCol < 1) {
                  iVar6 = 0;
                }
                else {
                  local_b8 = 0;
                  do {
                    iVar6 = 0;
                    if (0 < local_98.nPhrase) {
                      lVar22 = 0;
                      iVar7 = 0;
                      ppOut = &pCtx->pRead;
                      do {
                        iVar6 = sqlite3Fts3EvalPhrasePoslist
                                          (pFVar3,((LcsIterator *)(ppOut + -2))->pExpr,(int)local_b8
                                           ,ppOut);
                        if (iVar6 != 0) goto LAB_001d5a95;
                        if (*ppOut != (char *)0x0) {
                          *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                          fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                          if (*ppOut == (char *)0x0) {
                            iVar6 = 0x10b;
                            goto LAB_001d5a95;
                          }
                          iVar7 = iVar7 + 1;
                        }
                        lVar22 = lVar22 + 1;
                        uVar14 = (ulong)local_98.nPhrase;
                        ppOut = ppOut + 4;
                      } while (lVar22 < (long)uVar14);
                      iVar6 = 0;
                      if (0 < iVar7) {
                        while( true ) {
                          if ((int)uVar14 < 1) {
                            pIter = (LcsIterator *)0x0;
                          }
                          else {
                            uVar14 = uVar14 & 0xffffffff;
                            iVar8 = 0;
                            pIter = (LcsIterator *)0x0;
                            pLVar17 = pCtx;
                            do {
                              if (pLVar17->pRead == (char *)0x0) {
                                iVar8 = 0;
                              }
                              else {
                                if ((pIter == (LcsIterator *)0x0) || (pLVar17->iPos < pIter->iPos))
                                {
                                  pIter = pLVar17;
                                }
                                if ((iVar8 == 0) || (iVar4 = 1, pLVar17->iPos == pLVar17[-1].iPos))
                                {
                                  iVar4 = iVar8 + 1;
                                }
                                iVar8 = iVar4;
                                if (iVar6 < iVar8) {
                                  iVar6 = iVar8;
                                }
                              }
                              pLVar17 = pLVar17 + 1;
                              uVar14 = uVar14 - 1;
                            } while (uVar14 != 0);
                          }
                          iVar8 = fts3LcsIteratorAdvance(pIter);
                          if (iVar7 - iVar8 == 0 || iVar7 < iVar8) break;
                          uVar14 = (ulong)local_98._8_8_ >> 0x20;
                          iVar7 = iVar7 - iVar8;
                        }
                      }
                    }
                    *(int *)((long)local_98.aMatchinfo + local_b8 * 4) = iVar6;
                    local_b8 = local_b8 + 1;
                    iVar6 = 0;
                  } while (local_b8 < local_98.nCol);
                }
LAB_001d5a95:
                sqlite3_free(pCtx);
                local_4c = iVar6;
              }
            }
            break;
          default:
            if (bVar5 != 0x79) goto switchD_001d5403_caseD_6d;
LAB_001d54e6:
            sVar10 = fts3MatchinfoSize(&local_98,bVar5);
            memset(__s,0,sVar10 * 4);
            iVar6 = fts3ExprLHitGather(pFVar3->pExpr,&local_98);
            local_4c = iVar6;
          }
        }
        sVar10 = fts3MatchinfoSize(&local_98,__s2[lVar23]);
        __s = (u8 *)((long)local_98.aMatchinfo + sVar10 * 4);
        lVar23 = lVar23 + 1;
        local_98.aMatchinfo = (u32 *)__s;
      } while (iVar6 == 0);
      sqlite3_reset(local_58);
      if (!bVar2) {
        pMVar12 = pFVar3->pMIBuffer;
        pMVar12->bGlobal = 1;
        memcpy(pMVar12[1].aRef + (long)pMVar12->nElem * 4,&pMVar12->field_0x1c,
               (long)pMVar12->nElem << 2);
      }
      if (iVar6 == 0) {
        setResultStrOrError(pContext,(char *)z,pFVar3->pMIBuffer->nElem << 2,'\0',local_c0);
      }
      else {
        sqlite3_result_error_code(pContext,iVar6);
        (*local_c0)(z);
      }
    }
LAB_001d5b6d:
    sqlite3_blob_close((sqlite3_blob *)psVar1[0x14].pModule);
    psVar1[0x14].pModule = (sqlite3_module *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d5bb1:
  __stack_chk_fail();
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}